

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O2

bool cmWriteFileCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string *fileName;
  _Ios_Openmode _Var1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  pointer pbVar4;
  Status SVar5;
  ostream *poVar6;
  string *__lhs;
  bool bVar7;
  mode_t mode;
  cmExecutionStatus *local_298;
  string dir;
  string message;
  string error;
  ofstream file;
  
  fileName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar4 - (long)fileName) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"called with incorrect number of arguments",
               (allocator<char> *)&message);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&file);
    bVar7 = false;
  }
  else {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    bVar7 = true;
    __lhs = fileName;
    local_298 = status;
    while (pcVar2 = local_298, __lhs = __lhs + 1, __lhs != pbVar4) {
      bVar3 = std::operator==(__lhs,"APPEND");
      if (bVar3) {
        bVar7 = false;
      }
      else {
        std::__cxx11::string::append((string *)&message);
      }
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar3 = cmMakefile::CanIWriteThisFile(local_298->Makefile,fileName);
    if (bVar3) {
      cmsys::SystemTools::GetFilenamePath(&dir,fileName);
      cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
      mode = 0;
      SVar5 = cmsys::SystemTools::GetPermissions((fileName->_M_dataplus)._M_p,&mode);
      if (SVar5.Kind_ == Success) {
        bVar3 = true;
        if (-1 < (char)mode) {
          bVar3 = false;
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,mode | 0x90,false);
        }
      }
      else {
        bVar3 = false;
      }
      _Var1 = _S_app;
      if (bVar7) {
        _Var1 = _S_out;
      }
      std::ofstream::ofstream(&file,(fileName->_M_dataplus)._M_p,_Var1);
      bVar7 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar7) {
        poVar6 = std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&message);
        std::operator<<(poVar6,'\n');
        std::ofstream::close();
        if (!bVar3 && mode != 0) {
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,mode,false);
        }
      }
      else {
        cmStrCat<char_const(&)[48],std::__cxx11::string_const&,char_const(&)[14]>
                  (&error,(char (*) [48])"Internal CMake error when trying to open file: ",fileName,
                   (char (*) [14])" for writing.");
        std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
        std::__cxx11::string::~string((string *)&error);
      }
      std::ofstream::~ofstream(&file);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      std::operator+(&dir,"attempted to write a file: ",fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir
                     ," into a source directory.");
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::string::~string((string *)&file);
      bVar7 = false;
    }
    std::__cxx11::string::~string((string *)&message);
  }
  return bVar7;
}

Assistant:

bool cmWriteFileCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string message;
  auto i = args.begin();

  std::string const& fileName = *i;
  bool overwrite = true;
  i++;

  for (; i != args.end(); ++i) {
    if (*i == "APPEND") {
      overwrite = false;
    } else {
      message += *i;
    }
  }

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName.c_str(), mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName.c_str(), newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       overwrite ? std::ios::out : std::ios::app);
  if (!file) {
    std::string error =
      cmStrCat("Internal CMake error when trying to open file: ", fileName,
               " for writing.");
    status.SetError(error);
    return false;
  }
  file << message << '\n';
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
  }

  return true;
}